

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O1

bool __thiscall QSQLiteResult::exec(QSQLiteResult *this)

{
  char *pcVar1;
  QSQLiteResultPrivate *this_00;
  QString *pQVar2;
  long lVar3;
  sqlite3_stmt *psVar4;
  double rValue;
  char cVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  char *pcVar12;
  sqlite_int64 iValue;
  ulong uVar13;
  undefined8 *puVar14;
  QVariant *pQVar15;
  uint uVar16;
  ulong uVar17;
  storage_type_conflict *psVar18;
  long lVar19;
  PrivateShared *pPVar20;
  long in_FS_OFFSET;
  bool bVar21;
  QByteArrayView QVar22;
  QStringView QVar23;
  QTime time;
  QList<int> local_d0;
  QString local_b8;
  undefined1 local_98 [32];
  QArrayDataPointer<QVariant> local_78;
  QArrayDataPointer<QVariant> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSQLiteResultPrivate **)&this->field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  plVar10 = (long *)QSqlResult::boundValues();
  local_58.d = (Data *)*plVar10;
  local_58.ptr = (QVariant *)plVar10[1];
  local_58.size = plVar10[2];
  if (local_58.d != (Data *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00->skippedStatus = false;
  this_00->skipRow = false;
  QSqlRecord::clear();
  QSqlCachedResult::clearValues();
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QVariant *)0x0;
  local_98._16_8_ = (CollSeq *)0x0;
  local_98._0_8_ = (sqlite3_vfs *)0x0;
  local_98._8_8_ = (Vdbe *)0x0;
  local_b8.d.size = 0;
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  QSqlError::QSqlError
            ((QSqlError *)&local_d0,(QString *)(local_98 + 0x20),(QString *)local_98,NoError,
             &local_b8);
  (**(code **)(*(long *)this + 0x28))(this);
  QSqlError::~QSqlError((QSqlError *)&local_d0);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((sqlite3_vfs *)local_98._0_8_ != (sqlite3_vfs *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
    }
  }
  if ((Db *)local_78.d != (Db *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
    }
  }
  iVar7 = sqlite3_reset(this_00->stmt);
  if (iVar7 == 0) {
    uVar8 = sqlite3_bind_parameter_count(this_00->stmt);
    bVar21 = local_58.size == (int)uVar8;
    if ((int)uVar8 < local_58.size && 0 < (int)uVar8) {
      lVar11 = *(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x78;
      if (lVar11 == 0) {
        lVar11 = 0;
LAB_00113a1d:
        uVar13 = 0;
      }
      else {
        if (**(char **)(lVar11 + 0x20) != -1) goto LAB_00113a1d;
        uVar17 = 1;
        do {
          uVar13 = uVar17;
          if (*(ulong *)(lVar11 + 0x10) == uVar13) {
            lVar11 = 0;
            uVar13 = 0;
            break;
          }
          uVar17 = uVar13 + 1;
        } while ((*(char **)(lVar11 + 0x20))[(ulong)((uint)uVar13 & 0x7f) + (uVar13 >> 7) * 0x90] ==
                 -1);
      }
      uVar17 = 0;
      if (lVar11 != 0 || uVar13 != 0) {
        do {
          lVar3 = *(long *)(lVar11 + 0x20);
          lVar19 = (uVar13 >> 7) * 0x90;
          uVar16 = (int)uVar17 +
                   *(int *)(*(long *)(lVar3 + 0x80 + lVar19) + 0x28 +
                           (ulong)((uint)*(byte *)((ulong)((uint)uVar13 & 0x7f) + lVar3 + lVar19) *
                                  0x30));
          uVar17 = (ulong)uVar16;
          do {
            if (*(long *)(lVar11 + 0x10) - 1U == uVar13) {
              uVar13 = 0;
              lVar11 = 0;
              break;
            }
            uVar13 = uVar13 + 1;
          } while (*(char *)((ulong)((uint)uVar13 & 0x7f) + (uVar13 >> 7) * 0x90 + lVar3) == -1);
        } while ((uVar13 != 0) || (lVar11 != 0));
        uVar17 = (ulong)(int)uVar16;
      }
      bVar21 = local_58.size == uVar17;
      local_78.d = (Data *)0x0;
      local_78.ptr = (QVariant *)0x0;
      iVar7 = 0;
      local_78.size = 0;
      local_98._0_8_ = (sqlite3_vfs *)0x0;
      local_98._8_8_ = (Vdbe *)0x0;
      local_98._16_8_ = (CollSeq *)0x0;
      if (local_58.size != 0) {
        bVar21 = local_58.size == uVar17;
        uVar13 = 0;
        do {
          if ((CollSeq *)local_98._16_8_ == (CollSeq *)0x0) {
LAB_00113b29:
            lVar11 = -1;
          }
          else {
            lVar11 = -4;
            do {
              lVar3 = local_98._16_8_ * -4 + lVar11;
              if (lVar3 == -4) goto LAB_00113b23;
              lVar19 = lVar11 + 4;
              lVar11 = lVar11 + 4;
            } while (uVar13 != *(uint *)((long)(sqlite3 **)local_98._8_8_ + lVar19));
            lVar11 = lVar11 >> 2;
LAB_00113b23:
            if (lVar3 == -4) goto LAB_00113b29;
          }
          if (lVar11 == -1) {
            iVar9 = iVar7 + 1;
            pcVar12 = sqlite3_bind_parameter_name(this_00->stmt,iVar9);
            if (pcVar12 == (char *)0x0) {
              bVar21 = false;
            }
            else {
              local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
              local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
              psVar18 = (storage_type_conflict *)0xffffffffffffffff;
              do {
                pcVar1 = pcVar12 + 1 + (long)psVar18;
                psVar18 = psVar18 + 1;
              } while (*pcVar1 != '\0');
              QVar22.m_data = psVar18;
              QVar22.m_size = (qsizetype)&local_b8;
              QString::fromUtf8(QVar22);
              QHash<QString,_QList<int>_>::value
                        (&local_d0,
                         (QHash<QString,_QList<int>_> *)
                         &(this_00->super_QSqlCachedResultPrivate).field_0x78,&local_b8);
              QtPrivate::QCommonArrayOps<int>::growAppend
                        ((QCommonArrayOps<int> *)local_98,local_d0.d.ptr,
                         local_d0.d.ptr + local_d0.d.size);
              QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant_const&>
                        ((QMovableArrayOps<QVariant> *)(local_98 + 0x20),local_78.size,
                         local_58.ptr + *local_d0.d.ptr);
              QList<QVariant>::end((QList<QVariant> *)(local_98 + 0x20));
              if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,4,0x10);
                }
              }
              iVar7 = iVar9;
              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)local_58.size);
      }
      QArrayDataPointer<QVariant>::operator=
                (&local_58,(QArrayDataPointer<QVariant> *)(local_98 + 0x20));
      if ((sqlite3_vfs *)local_98._0_8_ != (sqlite3_vfs *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_98._0_8_,4,0x10);
        }
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer
                ((QArrayDataPointer<QVariant> *)(local_98 + 0x20));
    }
    if (bVar21) {
      if (0 < (int)uVar8) {
        iVar7 = 1;
        lVar11 = 0;
        do {
          pQVar15 = local_58.ptr;
          pPVar20 = (PrivateShared *)((long)&((local_58.ptr)->d).data + lVar11);
          cVar5 = QSqlResultPrivate::isVariantNull((QVariant *)pPVar20);
          if (cVar5 != '\0') {
            iVar9 = sqlite3_bind_null(this_00->stmt,iVar7);
            goto LAB_00113cec;
          }
          iVar9 = QVariant::typeId((QVariant *)pPVar20);
          switch(iVar9) {
          case 1:
          case 2:
            psVar4 = this_00->stmt;
            iVar9 = QVariant::toInt((bool *)pPVar20);
            iVar9 = sqlite3_bind_int(psVar4,iVar7,iVar9);
            break;
          case 3:
          case 4:
            psVar4 = this_00->stmt;
            iValue = QVariant::toLongLong((bool *)pPVar20);
            iVar9 = sqlite3_bind_int64(psVar4,iVar7,iValue);
            break;
          default:
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
            QVariant::toString();
            goto LAB_00113f28;
          case 6:
            psVar4 = this_00->stmt;
            rValue = (double)QVariant::toDouble((bool *)pPVar20);
            iVar9 = sqlite3_bind_double(psVar4,iVar7,rValue);
            break;
          case 10:
            if (((&(pQVar15->d).field_0x18)[lVar11] & 1) != 0) {
              pPVar20 = (PrivateShared *)
                        ((long)*(int *)(*(long *)&pPVar20->field_0x0 + 4) +
                        *(long *)&pPVar20->field_0x0);
            }
            puVar14 = *(undefined8 **)((long)&(((QVariant *)pPVar20)->d).data + 8);
            if (puVar14 == (undefined8 *)0x0) {
              puVar14 = &QString::_empty;
            }
            iVar9 = sqlite3_bind_text16(this_00->stmt,iVar7,puVar14,
                                        *(int *)((long)&(((QVariant *)pPVar20)->d).data + 0x10) * 2,
                                        (_func_void_void_ptr *)0x0);
            break;
          case 0xc:
            if (((&(pQVar15->d).field_0x18)[lVar11] & 1) != 0) {
              pPVar20 = (((Private *)&pPVar20->field_0x0)->data).shared;
              pPVar20 = pPVar20 + *(int *)(pPVar20 + 4);
            }
            puVar14 = *(undefined8 **)&pPVar20[8].field_0x0;
            if (puVar14 == (undefined8 *)0x0) {
              puVar14 = &QByteArray::_empty;
            }
            iVar9 = sqlite3_bind_blob(this_00->stmt,iVar7,puVar14,*(int *)&pPVar20[0x10].field_0x0,
                                      (_func_void_void_ptr *)0x0);
            break;
          case 0xf:
            local_98._0_4_ = 0xaaaaaaaa;
            local_98._0_4_ = QVariant::toTime();
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
            QVar23.m_data = (storage_type *)local_98;
            QVar23.m_size = (qsizetype)(local_98 + 0x20);
            QTime::toString(QVar23);
LAB_00113f28:
            pQVar15 = local_78.ptr;
            if (local_78.ptr == (QVariant *)0x0) {
              pQVar15 = (QVariant *)&QString::_empty;
            }
            iVar9 = sqlite3_bind_text16(this_00->stmt,iVar7,pQVar15,(int)local_78.size * 2,
                                        (_func_void_void_ptr *)0xffffffffffffffff);
            if ((Db *)local_78.d != (Db *)0x0) {
              LOCK();
              ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
              }
            }
            break;
          case 0x10:
            local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QVariant::toDateTime();
            local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_78.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
            QDateTime::toString((int)local_98 + 0x20);
            pQVar15 = local_78.ptr;
            if (local_78.ptr == (QVariant *)0x0) {
              pQVar15 = (QVariant *)&QString::_empty;
            }
            iVar9 = sqlite3_bind_text16(this_00->stmt,iVar7,pQVar15,(int)local_78.size * 2,
                                        (_func_void_void_ptr *)0xffffffffffffffff);
            if ((Db *)local_78.d != (Db *)0x0) {
              LOCK();
              ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
              }
            }
            QDateTime::~QDateTime((QDateTime *)local_98);
          }
LAB_00113cec:
          if (iVar9 != 0) {
            pQVar2 = *(QString **)
                      (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8)
                      + 0xa8);
            QCoreApplication::translate
                      (local_98 + 0x20,"QSQLiteResult","Unable to bind parameters",0);
            qMakeError((sqlite3 *)local_98,pQVar2,(ErrorType)(local_98 + 0x20),2);
            (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_98);
            QSqlError::~QSqlError((QSqlError *)local_98);
            goto LAB_00113921;
          }
          iVar7 = iVar7 + 1;
          lVar11 = lVar11 + 0x20;
        } while ((ulong)uVar8 << 5 != lVar11);
      }
      bVar21 = QSQLiteResultPrivate::fetchNext(this_00,&this_00->firstRow,0,true);
      this_00->skippedStatus = bVar21;
      QSqlResult::lastError();
      cVar5 = QSqlError::isValid();
      QSqlError::~QSqlError((QSqlError *)(local_98 + 0x20));
      if (cVar5 == '\0') {
        bVar6 = QSqlRecord::isEmpty();
        (**(code **)(*(long *)this + 0x38))(this,bVar6 ^ 1);
        (**(code **)(*(long *)this + 0x20))(this,1);
        bVar21 = true;
      }
      else {
        bVar21 = false;
        (**(code **)(*(long *)this + 0x38))(this,0);
        (**(code **)(*(long *)this + 0x20))(this,0);
      }
      goto LAB_0011395d;
    }
    QCoreApplication::translate
              ((char *)(local_98 + 0x20),"QSQLiteResult","Parameter count mismatch",0);
    local_98._16_8_ = (CollSeq *)0x0;
    local_98._0_8_ = (sqlite3_vfs *)0x0;
    local_98._8_8_ = (Vdbe *)0x0;
    local_b8.d.size = 0;
    local_b8.d.d = (Data *)0x0;
    local_b8.d.ptr = (char16_t *)0x0;
    QSqlError::QSqlError
              ((QSqlError *)&local_d0,(QString *)(local_98 + 0x20),(QString *)local_98,
               StatementError,&local_b8);
    (**(code **)(*(long *)this + 0x28))(this,(QSqlError *)&local_d0);
    QSqlError::~QSqlError((QSqlError *)&local_d0);
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((sqlite3_vfs *)local_98._0_8_ != (sqlite3_vfs *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
    if ((Db *)local_78.d != (Db *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    pQVar2 = *(QString **)
              (*(long *)(*(long *)&(this_00->super_QSqlCachedResultPrivate).field_0x18 + 8) + 0xa8);
    QCoreApplication::translate(local_98 + 0x20,"QSQLiteResult","Unable to reset statement",0);
    qMakeError((sqlite3 *)local_98,pQVar2,(ErrorType)(local_98 + 0x20),2);
    (**(code **)(*(long *)this + 0x28))(this,(sqlite3 *)local_98);
    QSqlError::~QSqlError((QSqlError *)local_98);
LAB_00113921:
    if ((Db *)local_78.d != (Db *)0x0) {
      LOCK();
      ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d)->super_QArrayData,2,0x10);
      }
    }
    if (this_00->stmt != (sqlite3_stmt *)0x0) {
      sqlite3_finalize(this_00->stmt);
      this_00->stmt = (sqlite3_stmt *)0x0;
    }
  }
  bVar21 = false;
LAB_0011395d:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar21;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResult::exec()
{
    Q_D(QSQLiteResult);
    QList<QVariant> values = boundValues();

    d->skippedStatus = false;
    d->skipRow = false;
    d->rInf.clear();
    clearValues();
    setLastError(QSqlError());

    int res = sqlite3_reset(d->stmt);
    if (res != SQLITE_OK) {
        setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                     "Unable to reset statement"), QSqlError::StatementError, res));
        d->finalize();
        return false;
    }

    int paramCount = sqlite3_bind_parameter_count(d->stmt);
    bool paramCountIsValid = paramCount == values.size();

#if (SQLITE_VERSION_NUMBER >= 3003011)
    // In the case of the reuse of a named placeholder
    // We need to check explicitly that paramCount is greater than or equal to 1, as sqlite
    // can end up in a case where for virtual tables it returns 0 even though it
    // has parameters
    if (paramCount >= 1 && paramCount < values.size()) {
        const auto countIndexes = [](int counter, const QList<int> &indexList) {
                                      return counter + indexList.size();
                                  };

        const int bindParamCount = std::accumulate(d->indexes.cbegin(),
                                                   d->indexes.cend(),
                                                   0,
                                                   countIndexes);

        paramCountIsValid = bindParamCount == values.size();
        // When using named placeholders, it will reuse the index for duplicated
        // placeholders. So we need to ensure the QList has only one instance of
        // each value as SQLite will do the rest for us.
        QList<QVariant> prunedValues;
        QList<int> handledIndexes;
        for (int i = 0, currentIndex = 0; i < values.size(); ++i) {
            if (handledIndexes.contains(i))
                continue;
            const char *parameterName = sqlite3_bind_parameter_name(d->stmt, currentIndex + 1);
            if (!parameterName) {
                paramCountIsValid = false;
                continue;
            }
            const auto placeHolder = QString::fromUtf8(parameterName);
            const auto &indexes = d->indexes.value(placeHolder);
            handledIndexes << indexes;
            prunedValues << values.at(indexes.first());
            ++currentIndex;
        }
        values = prunedValues;
    }
#endif

    if (paramCountIsValid) {
        for (int i = 0; i < paramCount; ++i) {
            res = SQLITE_OK;
            const QVariant &value = values.at(i);

            if (QSqlResultPrivate::isVariantNull(value)) {
                res = sqlite3_bind_null(d->stmt, i + 1);
            } else {
                switch (value.userType()) {
                case QMetaType::QByteArray: {
                    const QByteArray *ba = static_cast<const QByteArray*>(value.constData());
                    res = sqlite3_bind_blob(d->stmt, i + 1, ba->constData(),
                                            ba->size(), SQLITE_STATIC);
                    break; }
                case QMetaType::Int:
                case QMetaType::Bool:
                    res = sqlite3_bind_int(d->stmt, i + 1, value.toInt());
                    break;
                case QMetaType::Double:
                    res = sqlite3_bind_double(d->stmt, i + 1, value.toDouble());
                    break;
                case QMetaType::UInt:
                case QMetaType::LongLong:
                    res = sqlite3_bind_int64(d->stmt, i + 1, value.toLongLong());
                    break;
                case QMetaType::QDateTime: {
                    const QDateTime dateTime = value.toDateTime();
                    const QString str = dateTime.toString(Qt::ISODateWithMs);
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QTime: {
                    const QTime time = value.toTime();
                    const QString str = time.toString(u"hh:mm:ss.zzz");
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size() * sizeof(ushort)),
                                              SQLITE_TRANSIENT);
                    break;
                }
                case QMetaType::QString: {
                    // lifetime of string == lifetime of its qvariant
                    const QString *str = static_cast<const QString*>(value.constData());
                    res = sqlite3_bind_text16(d->stmt, i + 1, str->unicode(),
                                              int(str->size()) * sizeof(QChar),
                                              SQLITE_STATIC);
                    break; }
                default: {
                    const QString str = value.toString();
                    // SQLITE_TRANSIENT makes sure that sqlite buffers the data
                    res = sqlite3_bind_text16(d->stmt, i + 1, str.data(),
                                              int(str.size()) * sizeof(QChar),
                                              SQLITE_TRANSIENT);
                    break; }
                }
            }
            if (res != SQLITE_OK) {
                setLastError(qMakeError(d->drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                             "Unable to bind parameters"), QSqlError::StatementError, res));
                d->finalize();
                return false;
            }
        }
    } else {
        setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult",
                        "Parameter count mismatch"), QString(), QSqlError::StatementError));
        return false;
    }
    d->skippedStatus = d->fetchNext(d->firstRow, 0, true);
    if (lastError().isValid()) {
        setSelect(false);
        setActive(false);
        return false;
    }
    setSelect(!d->rInf.isEmpty());
    setActive(true);
    return true;
}